

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_print_some_keys(EditLine *el,el_action_t *map,wint_t first,wint_t last)

{
  el_bindings_t *peVar1;
  size_t sVar2;
  el_bindings_t *peVar3;
  wchar_t firstbuf [2];
  wchar_t lastbuf [2];
  char unparsbuf [1024];
  char extrabuf [1024];
  wchar_t local_838 [3];
  undefined4 local_82c;
  char local_828 [1024];
  char local_428 [1032];
  
  local_838[1] = 0;
  local_82c = 0;
  local_838[0] = first;
  local_838[2] = last;
  if ((uint)map[first] == L'\x1c') {
    if (first == last) {
      keymacro__decode_str(local_838,local_828,0x400,"\"\"");
      fprintf((FILE *)el->el_outfile,"%-15s->  is undefined\n",local_828);
    }
    return;
  }
  sVar2 = (el->el_map).nfunc;
  if (0 < (long)sVar2) {
    peVar3 = (el->el_map).help;
    peVar1 = peVar3 + sVar2;
    do {
      if (peVar3->func == (uint)map[first]) {
        keymacro__decode_str(local_838,local_828,0x400,"\"\"");
        if (first == last) {
          fprintf((FILE *)el->el_outfile,"%-15s->  %ls\n",local_828,peVar3->name);
          return;
        }
        keymacro__decode_str(local_838 + 2,local_428,0x400,"\"\"");
        fprintf((FILE *)el->el_outfile,"%-4s to %-7s->  %ls\n",local_828,local_428,peVar3->name);
        return;
      }
      peVar3 = peVar3 + 1;
    } while (peVar3 < peVar1);
  }
  abort();
}

Assistant:

static void
map_print_some_keys(EditLine *el, el_action_t *map, wint_t first, wint_t last)
{
	el_bindings_t *bp, *ep;
	wchar_t firstbuf[2], lastbuf[2];
	char unparsbuf[EL_BUFSIZ], extrabuf[EL_BUFSIZ];

	firstbuf[0] = first;
	firstbuf[1] = 0;
	lastbuf[0] = last;
	lastbuf[1] = 0;
	if (map[first] == ED_UNASSIGNED) {
		if (first == last) {
			(void) keymacro__decode_str(firstbuf, unparsbuf,
			    sizeof(unparsbuf), STRQQ);
			(void) fprintf(el->el_outfile,
			    "%-15s->  is undefined\n", unparsbuf);
		}
		return;
	}
	ep = &el->el_map.help[el->el_map.nfunc];
	for (bp = el->el_map.help; bp < ep; bp++) {
		if (bp->func == map[first]) {
			if (first == last) {
				(void) keymacro__decode_str(firstbuf, unparsbuf,
				    sizeof(unparsbuf), STRQQ);
				(void) fprintf(el->el_outfile, "%-15s->  %ls\n",
				    unparsbuf, bp->name);
			} else {
				(void) keymacro__decode_str(firstbuf, unparsbuf,
				    sizeof(unparsbuf), STRQQ);
				(void) keymacro__decode_str(lastbuf, extrabuf,
				    sizeof(extrabuf), STRQQ);
				(void) fprintf(el->el_outfile,
				    "%-4s to %-7s->  %ls\n",
				    unparsbuf, extrabuf, bp->name);
			}
			return;
		}
	}
#ifdef MAP_DEBUG
	if (map == el->el_map.key) {
		(void) keymacro__decode_str(firstbuf, unparsbuf,
		    sizeof(unparsbuf), STRQQ);
		(void) fprintf(el->el_outfile,
		    "BUG!!! %s isn't bound to anything.\n", unparsbuf);
		(void) fprintf(el->el_outfile, "el->el_map.key[%d] == %d\n",
		    first, el->el_map.key[first]);
	} else {
		(void) keymacro__decode_str(firstbuf, unparsbuf,
		    sizeof(unparsbuf), STRQQ);
		(void) fprintf(el->el_outfile,
		    "BUG!!! %s isn't bound to anything.\n", unparsbuf);
		(void) fprintf(el->el_outfile, "el->el_map.alt[%d] == %d\n",
		    first, el->el_map.alt[first]);
	}
#endif
	EL_ABORT((el->el_errfile, "Error printing keys\n"));
}